

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_type __thiscall Catch::StringRef::numberOfCharacters(StringRef *this)

{
  char cVar1;
  size_type sVar2;
  ulong uStack_20;
  char c;
  size_type i;
  size_type noChars;
  StringRef *this_local;
  
  i = this->m_size;
  for (uStack_20 = 0; uStack_20 < this->m_size; uStack_20 = uStack_20 + 1) {
    cVar1 = this->m_start[uStack_20];
    if (((int)cVar1 & 0xc0U) == 0xc0) {
      sVar2 = i - 1;
      if (((int)cVar1 & 0xe0U) == 0xe0) {
        sVar2 = i - 2;
      }
      i = sVar2;
      if (((int)cVar1 & 0xf0U) == 0xf0) {
        i = i - 1;
      }
    }
  }
  return i;
}

Assistant:

auto StringRef::numberOfCharacters() const noexcept -> size_type {
        size_type noChars = m_size;
        // Make adjustments for uft encodings
        for( size_type i=0; i < m_size; ++i ) {
            char c = m_start[i];
            if( ( c & byte_2_lead ) == byte_2_lead ) {
                noChars--;
                if (( c & byte_3_lead ) == byte_3_lead )
                    noChars--;
                if( ( c & byte_4_lead ) == byte_4_lead )
                    noChars--;
            }
        }
        return noChars;
    }